

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall
VGMPlayer::DoRAMOfsPatches
          (VGMPlayer *this,UINT8 chipType,UINT8 chipID,UINT32 *dataOfs,UINT32 *dataLen)

{
  UINT32 *dataLen_local;
  UINT32 *dataOfs_local;
  UINT8 chipID_local;
  UINT8 chipType_local;
  VGMPlayer *this_local;
  
  if (chipType == '\x05') {
    *dataOfs = (uint)this->_rf5cBank[0][chipID] << 0xc | *dataOfs;
  }
  else if (chipType == '\x10') {
    *dataOfs = (uint)this->_rf5cBank[1][chipID] << 0xc | *dataOfs;
  }
  return;
}

Assistant:

void VGMPlayer::DoRAMOfsPatches(UINT8 chipType, UINT8 chipID, UINT32& dataOfs, UINT32& dataLen)
{
	switch(chipType)
	{
	case 0x05:	// RF5C68
		dataOfs |= (_rf5cBank[0][chipID] << 12);	// add current memory bank to offset
		break;
	case 0x10:	// RF5C164
		dataOfs |= (_rf5cBank[1][chipID] << 12);	// add current memory bank to offset
		break;
	}
	
	return;
}